

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>::
compile_int_assign(statement_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
                   *this,typed_lvalue_expression_t *lvalue,typed_expression_t *rvalue)

{
  expression_type_t eVar1;
  back_insert_iterator<std::vector<long,_std::allocator<long>_>_> *this_00;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  rvalue_compiler;
  lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  lvalue_compiler;
  variable_bounds_visitor_t bounds_visitor;
  value_type_conflict2 local_60;
  undefined **local_58;
  vector<long,_std::allocator<long>_> *local_50;
  undefined **local_48;
  vector<long,_std::allocator<long>_> *local_40;
  undefined **local_38;
  undefined8 local_30;
  
  local_38 = &PTR__typed_expression_visitor_t_001f3db8;
  local_30 = 0x7fffffff80000000;
  (**(code **)(*(long *)&lvalue->super_typed_expression_t + 0x30))(lvalue,&local_38);
  local_50 = (this->_bytecode_back_inserter).container;
  this_00 = &this->_bytecode_back_inserter;
  local_48 = &PTR__typed_expression_visitor_t_001f3c98;
  local_58 = &PTR__typed_expression_visitor_t_001f3c10;
  local_40 = local_50;
  (**(code **)(*(long *)&lvalue->super_typed_expression_t + 0x30))(lvalue);
  (**(code **)(*(long *)rvalue + 0x30))(rvalue,&local_58);
  local_60 = 2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=(this_00,&local_60)
  ;
  local_60 = (value_type_conflict2)(int)local_30;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=(this_00,&local_60)
  ;
  local_60 = (value_type_conflict2)local_30._4_4_;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=(this_00,&local_60)
  ;
  eVar1 = (lvalue->super_typed_expression_t)._type;
  if ((eVar1 == EXPR_TYPE_LOCALINTLVALUE) || (eVar1 == EXPR_TYPE_LOCALINTVAR)) {
    local_60 = 0x1b;
  }
  else {
    local_60 = 7;
  }
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=(this_00,&local_60)
  ;
  return;
}

Assistant:

void compile_int_assign(tchecker::typed_lvalue_expression_t const & lvalue, tchecker::typed_expression_t const & rvalue)
  {
    // Get lvalue bounds
    tchecker::details::variable_bounds_visitor_t bounds_visitor;
    lvalue.visit(bounds_visitor);

    // Write bytecode
    tchecker::details::lvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> lvalue_compiler(_bytecode_back_inserter);
    tchecker::details::rvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> rvalue_compiler(_bytecode_back_inserter);

    lvalue.visit(lvalue_compiler);
    rvalue.visit(rvalue_compiler);
    _bytecode_back_inserter = tchecker::VM_FAILNOTIN;
    _bytecode_back_inserter = bounds_visitor.min();
    _bytecode_back_inserter = bounds_visitor.max();
    if (lvalue.type() == EXPR_TYPE_LOCALINTLVALUE || lvalue.type() == EXPR_TYPE_LOCALINTVAR)
      _bytecode_back_inserter = tchecker::VM_ASSIGN_FRAME;
    else
      _bytecode_back_inserter = tchecker::VM_ASSIGN;
  }